

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O2

string * __thiscall
Disassembler::getLabel_abi_cxx11_(string *__return_storage_ptr__,Disassembler *this,int line)

{
  string *psVar1;
  string *psVar2;
  long lVar3;
  string *psVar4;
  allocator local_9;
  
  lVar3 = ((long)labels_abi_cxx11_.
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)labels_abi_cxx11_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28 + 1;
  psVar4 = (string *)
           &labels_abi_cxx11_.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[-1].second;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
      return __return_storage_ptr__;
    }
    psVar1 = psVar4 + 0x28;
    psVar2 = psVar4 + 0x20;
    psVar4 = psVar1;
  } while (*(int *)psVar2 != (int)this + 2);
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::getLabel(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2) {// .globl e .text
      return labels[i].second;
    }
  return "";
}